

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

string * __thiscall
Character::GetChatLogDump_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  _Elt_pointer pbVar1;
  _Map_pointer ppbVar2;
  string *line;
  _Elt_pointer pbVar3;
  _Elt_pointer pbVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar3 = (this->chat_log).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar1 = (this->chat_log).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar3 != pbVar1) {
    pbVar4 = (this->chat_log).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar2 = (this->chat_log).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pbVar3->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pbVar3 = pbVar3 + 1;
      if (pbVar3 == pbVar4) {
        pbVar3 = ppbVar2[1];
        ppbVar2 = ppbVar2 + 1;
        pbVar4 = pbVar3 + 0x10;
      }
    } while (pbVar3 != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Character::GetChatLogDump()
{
	std::string result;

	for (const std::string& line : chat_log)
	{
		result += line;
		result += "\r\n";
	}

	return result;
}